

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O3

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT<double>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  uint uVar1;
  long lVar2;
  int64_t iVar3;
  TPZFMatrix<double> *pTVar4;
  TPZFMatrix<double> *pTVar5;
  TPZConnect *pTVar6;
  int64_t iVar7;
  TPZCompEl **ppTVar8;
  TPZCompMesh *pTVar9;
  int iVar10;
  ulong uVar11;
  int64_t nelem;
  long nelem_00;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_50;
  
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019e0ed0;
  local_50.fStore = (pair<TPZCompMesh_*,_long> *)0x0;
  local_50.fNElements = 0;
  local_50.fNAlloc = 0;
  ComputeAtomicIndexes(MFMesh,&local_50);
  iVar3 = local_50.fNElements;
  pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&MFMesh->fSolution);
  if (0 < iVar3) {
    nelem = 0;
    do {
      pTVar9 = local_50.fStore[nelem].first;
      if (pTVar9 != (TPZCompMesh *)0x0) {
        pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar9->fSolution);
        pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(pTVar9->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                            local_50.fStore[nelem].second);
        if (pTVar6->fSequenceNumber < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x1aa);
        }
        iVar10 = (int)pTVar6->fSequenceNumber;
        uVar1 = (pTVar9->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar10].dim;
        pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(MFMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
        lVar2 = pTVar6->fSequenceNumber;
        if (lVar2 < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x1ae);
        }
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            iVar7 = TPZBlock::Index(&MFMesh->fBlock,lVar2,(int)uVar11);
            pTVar5->fElem
            [(long)(pTVar9->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar10].pos + uVar11
            ] = pTVar4->fElem[iVar7];
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
      }
      nelem = nelem + 1;
    } while (nelem != iVar3);
  }
  lVar2 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar2) {
    nelem_00 = 0;
    do {
      ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem_00);
      if (*ppTVar8 != (TPZCompEl *)0x0) {
        pTVar9 = (TPZCompMesh *)
                 __dynamic_cast(*ppTVar8,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
        if (pTVar9 != (TPZCompMesh *)0x0) {
          TransferFromMultiPhysics(cmeshVec,pTVar9);
        }
      }
      nelem_00 = nelem_00 + 1;
    } while (lVar2 != nelem_00);
  }
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019e0ed0;
  if (local_50.fStore != (pair<TPZCompMesh_*,_long> *)0x0) {
    operator_delete__(local_50.fStore);
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        //TODOCOMPLEX
        if(!atomic_mesh) continue;
        TPZFMatrix<TVar> &atomic_mesh_sol = atomic_mesh->Solution();
        TPZBlock &block = atomic_mesh->Block();
        int64_t atomicindexconnect = indexes[connect].second;
        TPZConnect &con = atomic_mesh->ConnectVec()[atomicindexconnect];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            TVar val = solMF(blockMF.Index(seqnumMF, idf));
            int64_t pos = block.Position(seqnum);
            atomic_mesh_sol(pos+idf) = val;
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMultiPhysics(cmeshVec, sub);
        }
    }
}